

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

Pass * wasm::createVacuumPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x1a0);
  memset(this,0,0x1a0);
  Vacuum::Vacuum((Vacuum *)this);
  return this;
}

Assistant:

Pass* createVacuumPass() { return new Vacuum(); }